

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O2

void argon2(Argon2Flavour flavour,uint32_t mem,uint32_t passes,uint32_t parallel,uint32_t taglen,
           ptrlen P,ptrlen S,ptrlen K,ptrlen X,strbuf *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  void *vout;
  ssh_hash *psVar6;
  void *__s;
  ulong uVar7;
  uint8_t *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t factor1;
  long lVar13;
  long lVar14;
  ulong uVar15;
  size_t i;
  unsigned_long uVar16;
  uint uVar17;
  void *pvVar18;
  size_t jpre;
  ulong val;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ulong local_11c0;
  ulong local_11a0;
  uint slice;
  uint8_t local_1078;
  undefined1 local_1077;
  undefined1 local_1076;
  undefined1 local_1075;
  undefined1 local_1074;
  undefined1 local_1073;
  undefined1 local_1072;
  undefined1 local_1071;
  undefined1 local_1070;
  undefined1 local_106f;
  undefined1 local_106e;
  undefined1 local_106d;
  undefined1 local_106c;
  undefined1 local_106b;
  undefined1 local_106a;
  undefined1 local_1069;
  undefined1 local_1068;
  undefined4 local_1067;
  undefined3 uStack_1063;
  undefined1 local_1060;
  undefined1 local_105f;
  undefined1 local_105e;
  undefined1 local_105d;
  undefined1 local_105c;
  undefined1 local_105b;
  undefined1 local_105a;
  undefined1 local_1059;
  undefined1 local_1058;
  undefined1 local_1057;
  undefined1 local_1056;
  undefined1 local_1055;
  undefined4 local_1054;
  undefined1 local_1050;
  undefined1 local_104f;
  undefined1 local_104e;
  undefined1 local_104d;
  undefined4 local_104c;
  undefined1 local_1048;
  undefined1 local_1047;
  undefined1 local_1046;
  undefined1 local_1045;
  undefined1 local_1044;
  undefined1 local_1043;
  undefined1 local_1042;
  undefined1 local_1041;
  undefined1 local_1040 [968];
  uint8_t h0 [64];
  blk out2i;
  uint8_t local_830 [1024];
  blk tmp2i;
  
  vout = strbuf_append(out,(ulong)taglen);
  psVar6 = blake2b_new_general(0x40);
  val = (ulong)parallel;
  BinarySink_put_uint32_le(psVar6->binarysink_,val);
  BinarySink_put_uint32_le(psVar6->binarysink_,(ulong)taglen);
  BinarySink_put_uint32_le(psVar6->binarysink_,(ulong)mem);
  BinarySink_put_uint32_le(psVar6->binarysink_,(ulong)passes);
  BinarySink_put_uint32_le(psVar6->binarysink_,0x13);
  BinarySink_put_uint32_le(psVar6->binarysink_,(ulong)flavour);
  BinarySink_put_stringpl_le(psVar6->binarysink_,P);
  BinarySink_put_stringpl_le(psVar6->binarysink_,S);
  BinarySink_put_stringpl_le(psVar6->binarysink_,K);
  BinarySink_put_stringpl_le(psVar6->binarysink_,X);
  ssh_hash_final(psVar6,h0);
  uVar1 = (ulong)mem / (ulong)(parallel * 4);
  uVar10 = uVar1 * 4;
  factor1 = uVar10 * val;
  __s = safemalloc(factor1,0x400,0);
  memset(__s,0,factor1 * 0x400);
  pvVar18 = __s;
  for (uVar16 = 0; val != uVar16; uVar16 = uVar16 + 1) {
    psVar6 = hprime_new(0x400);
    BinarySink_put_data(psVar6->binarysink_,h0,0x40);
    BinarySink_put_uint32_le(psVar6->binarysink_,0);
    BinarySink_put_uint32_le(psVar6->binarysink_,uVar16);
    hprime_final(psVar6,0x400,pvVar18);
    pvVar18 = (void *)((long)pvVar18 + 0x400);
  }
  pvVar18 = (void *)(val * 0x400 + (long)__s);
  for (uVar16 = 0; val != uVar16; uVar16 = uVar16 + 1) {
    psVar6 = hprime_new(0x400);
    BinarySink_put_data(psVar6->binarysink_,h0,0x40);
    BinarySink_put_uint32_le(psVar6->binarysink_,1);
    BinarySink_put_uint32_le(psVar6->binarysink_,uVar16);
    hprime_final(psVar6,0x400,pvVar18);
    pvVar18 = (void *)((long)pvVar18 + 0x400);
  }
  bVar20 = flavour == Argon2d;
  local_11a0 = 2;
  for (local_11c0 = 0; local_11c0 != passes; local_11c0 = local_11c0 + 1) {
    _slice = 0;
    while (_slice != 4) {
      bVar21 = _slice == 2;
      bVar22 = local_11c0 == 0;
      uVar4 = ((uint)(_slice + 1) & 3) * (int)uVar1;
      if (bVar22) {
        uVar4 = 0;
      }
      uVar7 = _slice * uVar1;
      for (uVar15 = 0; uVar15 != val; uVar15 = uVar15 + 1) {
        lVar13 = 0;
        for (uVar19 = local_11a0; uVar19 < uVar1; uVar19 = uVar19 + 1) {
          lVar14 = uVar19 + uVar7;
          iVar5 = (int)uVar10;
          if (lVar14 != 0) {
            iVar5 = (int)lVar14;
          }
          uVar17 = iVar5 - 1;
          if (bVar20 || bVar22 && (bVar21 && flavour == Argon2id)) {
            puVar8 = (uint8_t *)((long)__s + (ulong)(uVar17 * parallel) * 0x400 + uVar15 * 0x400);
          }
          else {
            if (lVar13 == 0 || (uVar19 & 0x7f) == 0) {
              memset(local_1040,0,0x3c8);
              local_1078 = (uint8_t)local_11c0;
              local_1075 = (undefined1)(local_11c0 >> 0x18);
              local_1074 = (undefined1)(local_11c0 >> 0x20);
              local_1073 = (undefined1)(local_11c0 >> 0x28);
              local_1072 = (undefined1)(local_11c0 >> 0x30);
              local_1071 = (undefined1)(local_11c0 >> 0x38);
              local_1070 = (undefined1)uVar15;
              local_106d = (undefined1)(uVar15 >> 0x18);
              local_106c = (undefined1)(uVar15 >> 0x20);
              local_106b = (undefined1)(uVar15 >> 0x28);
              local_106a = (undefined1)(uVar15 >> 0x30);
              local_1069 = (undefined1)(uVar15 >> 0x38);
              local_1068 = (undefined1)_slice;
              uStack_1063 = 0;
              local_1067 = 0;
              local_1060 = (undefined1)factor1;
              local_105d = (undefined1)(factor1 >> 0x18);
              local_105c = (undefined1)(factor1 >> 0x20);
              local_105b = (undefined1)(factor1 >> 0x28);
              local_105a = (undefined1)(factor1 >> 0x30);
              local_1059 = (undefined1)(factor1 >> 0x38);
              local_1058 = (undefined1)passes;
              local_1057 = (undefined1)(passes >> 8);
              local_1056 = (undefined1)(passes >> 0x10);
              local_1055 = (undefined1)(passes >> 0x18);
              local_1054 = 0;
              local_1050 = (undefined1)flavour;
              local_104f = (undefined1)(flavour >> 8);
              local_104e = (undefined1)(flavour >> 0x10);
              local_104d = (undefined1)(flavour >> 0x18);
              local_104c = 0;
              lVar9 = (uVar19 >> 7) + 1;
              local_1048 = (undefined1)lVar9;
              local_1047 = (undefined1)((ulong)lVar9 >> 8);
              local_1046 = (undefined1)((ulong)lVar9 >> 0x10);
              local_1045 = (undefined1)((ulong)lVar9 >> 0x18);
              local_1044 = (undefined1)((ulong)lVar9 >> 0x20);
              local_1043 = (undefined1)((ulong)lVar9 >> 0x28);
              local_1042 = (undefined1)((ulong)lVar9 >> 0x30);
              local_1041 = (undefined1)((ulong)lVar9 >> 0x38);
              local_1077 = (char)(local_11c0 >> 8);
              local_1076 = (char)(local_11c0 >> 0x10);
              local_106f = (char)(uVar15 >> 8);
              local_106e = (char)(uVar15 >> 0x10);
              local_105f = (char)(factor1 >> 8);
              local_105e = (char)(factor1 >> 0x10);
              memset(&tmp2i,0,0x400);
              G_xor(tmp2i.data,tmp2i.data,&local_1078);
              memset(&out2i,0,0x400);
              G_xor(out2i.data,out2i.data,tmp2i.data);
            }
            puVar8 = out2i.data + ((int)local_11a0 * 8 + (int)lVar13 & 0x3f8);
          }
          uVar11 = uVar15 & 0xffffffff;
          if (_slice != 0 || local_11c0 != 0) {
            uVar11 = (ulong)*(uint *)(puVar8 + 4) % (ulong)parallel;
          }
          uVar12 = (ulong)uVar17;
          if ((uVar15 != uVar11) && (uVar12 = uVar7, uVar19 == 0)) {
            uVar12 = ((uVar7 & 0xffffffff) + (uVar10 - 1)) % uVar10;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar10;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (uVar12 & 0xffffffff) + (uVar10 - uVar4);
          G_xor((uint8_t *)((long)__s + lVar14 * val * 0x400 + uVar15 * 0x400),
                (uint8_t *)((long)__s + (ulong)(uVar17 * parallel) * 0x400 + uVar15 * 0x400),
                (uint8_t *)
                ((ulong)((int)((ulong)(~(uint)((SUB168(auVar3 % auVar2,0) & 0xffffffff) *
                                               ((ulong)*(uint *)puVar8 * (ulong)*(uint *)puVar8 >>
                                               0x20) >> 0x20) + SUB164(auVar3 % auVar2,0) + uVar4) %
                              uVar10) * parallel + (int)uVar11) * 0x400 + (long)__s));
          lVar13 = lVar13 + 8;
        }
      }
      local_11a0 = 0;
      _slice = _slice + 1;
      bVar20 = (bool)(bVar20 | (bVar22 && (bVar21 && flavour == Argon2id)));
    }
    local_11a0 = 0;
  }
  pvVar18 = (void *)((long)__s + (uVar10 - 1) * val * 0x400);
  memcpy(local_830,pvVar18,0x400);
  for (uVar10 = 1; uVar10 < val; uVar10 = uVar10 + 1) {
    memxor(local_830,local_830,(uint8_t *)(uVar10 * 0x400 + (long)pvVar18),0x400);
  }
  psVar6 = hprime_new(taglen);
  BinarySink_put_data(psVar6->binarysink_,local_830,0x400);
  hprime_final(psVar6,taglen,vout);
  smemclr(&out2i,0x400);
  smemclr(&tmp2i,0x400);
  smemclr(&local_1078,0x400);
  smemclr(local_830,0x400);
  smemclr(__s,factor1 * 0x400);
  safefree(__s);
  return;
}

Assistant:

void argon2(Argon2Flavour flavour, uint32_t mem, uint32_t passes,
            uint32_t parallel, uint32_t taglen,
            ptrlen P, ptrlen S, ptrlen K, ptrlen X, strbuf *out)
{
    argon2_internal(parallel, taglen, mem, passes, flavour,
                    P, S, K, X, strbuf_append(out, taglen));
}